

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseCompiler::_newConst
          (BaseCompiler *this,BaseMem *out,uint32_t scope,void *data,size_t size)

{
  uint32_t uVar1;
  uint32_t in_EAX;
  Error EVar2;
  ConstPoolNode *pCVar3;
  long lVar4;
  ConstPoolNode **out_00;
  size_t off;
  uint32_t local_38 [2];
  
  (out->super_Operand).super_Operand_._signature = 2;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  if (scope == 0) {
    lVar4 = 0x1a8;
  }
  else {
    if (scope != 1) {
      EVar2 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
      return EVar2;
    }
    lVar4 = 0x1b0;
  }
  pCVar3 = *(ConstPoolNode **)
            ((long)&(this->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter + lVar4);
  local_38[0] = in_EAX;
  if (pCVar3 == (ConstPoolNode *)0x0) {
    out_00 = (ConstPoolNode **)
             ((long)&(this->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter + lVar4);
    EVar2 = BaseBuilder::_newConstPoolNode(&this->super_BaseBuilder,out_00);
    if (EVar2 != 0) {
      return EVar2;
    }
    pCVar3 = *out_00;
  }
  EVar2 = ConstPool::add(&pCVar3->_constPool,data,size,(size_t *)local_38);
  if (EVar2 == 0) {
    uVar1 = (pCVar3->super_LabelNode)._labelId;
    (out->super_Operand).super_Operand_._signature = (int)size << 0x18 | 10;
    (out->super_Operand).super_Operand_._baseId = uVar1;
    (out->super_Operand).super_Operand_._data[0] = 0;
    (out->super_Operand).super_Operand_._data[1] = local_38[0];
    EVar2 = 0;
  }
  else {
    EVar2 = BaseEmitter::reportError((BaseEmitter *)this,EVar2,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error BaseCompiler::_newConst(BaseMem* out, uint32_t scope, const void* data, size_t size) {
  out->reset();
  ConstPoolNode** pPool;

  if (scope == ConstPool::kScopeLocal)
    pPool = &_localConstPool;
  else if (scope == ConstPool::kScopeGlobal)
    pPool = &_globalConstPool;
  else
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (!*pPool)
    ASMJIT_PROPAGATE(_newConstPoolNode(pPool));

  ConstPoolNode* pool = *pPool;
  size_t off;
  Error err = pool->add(data, size, off);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  *out = BaseMem(BaseMem::Decomposed {
    Label::kLabelTag,      // Base type.
    pool->labelId(),       // Base id.
    0,                     // Index type.
    0,                     // Index id.
    int32_t(off),          // Offset.
    uint32_t(size),        // Size.
    0                      // Flags.
  });

  return kErrorOk;
}